

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall Timer::Timer(Timer *this,timeType_ timeout,timeoutCallBack *callBack,int heapIndex)

{
  int heapIndex_local;
  timeoutCallBack *callBack_local;
  Timer *this_local;
  timeType_ timeout_local;
  
  noncopyable::noncopyable((noncopyable *)this);
  (this->timeout_).sec = timeout.sec;
  (this->timeout_).msec = timeout.msec;
  std::function<void_()>::function(&this->callBack_,callBack);
  this->heapIndex_ = heapIndex;
  return;
}

Assistant:

Timer::Timer(timeType_ timeout, timeoutCallBack callBack, int heapIndex)
    : timeout_(timeout), callBack_(std::move(callBack)), heapIndex_(heapIndex) {
}